

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O2

DFsVariable * __thiscall DFsScript::VariableForName(DFsScript *this,char *name)

{
  int iVar1;
  DFsVariable *pDVar2;
  TObjPtr<DFsVariable> *obj;
  
  iVar1 = variable_hash(name);
  obj = this->variables + iVar1;
  while( true ) {
    pDVar2 = GC::ReadBarrier<DFsVariable>((DFsVariable **)obj);
    if (pDVar2 == (DFsVariable *)0x0) {
      return (DFsVariable *)0x0;
    }
    iVar1 = strcmp(name,(pDVar2->Name).Chars);
    if (iVar1 == 0) break;
    obj = &pDVar2->next;
  }
  return pDVar2;
}

Assistant:

DFsVariable *DFsScript::VariableForName(const char *name)
{
	int n = variable_hash(name);
	DFsVariable *current = variables[n];
	
	while(current)
    {
		if(!strcmp(name, current->Name))        // found it?
			return current;         
		current = current->next;        // check next in chain
    }
	
	return NULL;
}